

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::emit_subgroup_op(CompilerMSL *this,Instruction *i)

{
  ushort uVar1;
  Platform PVar2;
  uint32_t uVar3;
  BaseType input_type;
  BaseType BVar4;
  uint32_t uVar5;
  uint32_t id;
  uint32_t *puVar6;
  CompilerError *pCVar7;
  char *pcVar8;
  uint32_t expr;
  char *pcVar9;
  bool bVar10;
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t mask;
  bool local_31;
  
  puVar6 = Compiler::stream((Compiler *)this,i);
  if ((this->msl_options).msl_version < 20000) {
    pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&mask,"Subgroups are only supported in Metal 2.0 and up.",
               (allocator *)&local_60);
    CompilerError::CompilerError(pCVar7,(string *)&mask);
    __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar1 = i->op;
  uVar3 = CompilerGLSL::get_integer_width_for_instruction(&this->super_CompilerGLSL,i);
  input_type = to_signed_basetype(uVar3);
  BVar4 = to_unsigned_basetype(uVar3);
  PVar2 = (this->msl_options).platform;
  if (PVar2 == macOS) {
    if (((this->msl_options).msl_version < 0x4e84) &&
       ((0xb < uVar1 - 0x151 || ((0xf01U >> (uVar1 - 0x151 & 0x1f) & 1) == 0)))) {
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,
                 "Subgroup ops beyond broadcast and shuffle on macOS require Metal 2.1 and up.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else if ((PVar2 == iOS) &&
          ((0x1d < uVar1 - 0x151 || ((0x30000f01U >> (uVar1 - 0x151 & 0x1f) & 1) == 0)))) {
    pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&mask,"iOS only supports quad-group operations.",(allocator *)&local_60);
    CompilerError::CompilerError(pCVar7,(string *)&mask);
    __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar3 = *puVar6;
  local_5c = puVar6[1];
  uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[2]);
  if (uVar5 != 3) {
    pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&mask,"Only subgroup scope is supported.",(allocator *)&local_60);
    CompilerError::CompilerError(pCVar7,(string *)&mask);
    __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  switch(uVar1) {
  case 0x14d:
    ::std::__cxx11::string::string((string *)&mask,"simd_is_first()",(allocator *)&local_60);
    expr = local_5c;
    CompilerGLSL::emit_op(&this->super_CompilerGLSL,uVar3,local_5c,(string *)&mask,true,false);
    ::std::__cxx11::string::~string((string *)&mask);
    goto LAB_002af0de;
  case 0x14e:
    uVar5 = puVar6[3];
    pcVar9 = "simd_all";
    break;
  case 0x14f:
    uVar5 = puVar6[3];
    pcVar9 = "simd_any";
    break;
  case 0x150:
    uVar5 = puVar6[3];
    pcVar9 = "spvSubgroupAllEqual";
    break;
  case 0x151:
    uVar5 = puVar6[3];
    id = puVar6[4];
    bVar10 = (this->msl_options).platform == iOS;
    pcVar8 = "quad_broadcast";
    pcVar9 = "simd_broadcast";
    goto LAB_002aec34;
  case 0x152:
    uVar5 = puVar6[3];
    pcVar9 = "simd_broadcast_first";
    break;
  case 0x153:
    uVar5 = puVar6[3];
    pcVar9 = "spvSubgroupBallot";
    break;
  case 0x154:
    uVar5 = puVar6[3];
    id = this->builtin_subgroup_invocation_id_id;
    goto LAB_002aece6;
  case 0x155:
    uVar5 = puVar6[3];
    id = puVar6[4];
LAB_002aece6:
    pcVar9 = "spvSubgroupBallotBitExtract";
    goto LAB_002af085;
  case 0x156:
    uVar5 = puVar6[3];
    if (uVar5 == 2) {
      uVar5 = puVar6[4];
      id = this->builtin_subgroup_invocation_id_id;
      pcVar9 = "spvSubgroupBallotExclusiveBitCount";
    }
    else {
      if (uVar5 != 1) {
        if (uVar5 != 0) {
          pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&mask,"Invalid BitCount operation.",(allocator *)&local_60);
          CompilerError::CompilerError(pCVar7,(string *)&mask);
          __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        uVar5 = puVar6[4];
        pcVar9 = "spvSubgroupBallotBitCount";
        break;
      }
      uVar5 = puVar6[4];
      id = this->builtin_subgroup_invocation_id_id;
      pcVar9 = "spvSubgroupBallotInclusiveBitCount";
    }
    goto LAB_002af085;
  case 0x157:
    uVar5 = puVar6[3];
    pcVar9 = "spvSubgroupBallotFindLSB";
    break;
  case 0x158:
    uVar5 = puVar6[3];
    pcVar9 = "spvSubgroupBallotFindMSB";
    break;
  case 0x159:
    uVar5 = puVar6[3];
    id = puVar6[4];
    bVar10 = (this->msl_options).platform == iOS;
    pcVar8 = "quad_shuffle";
    pcVar9 = "simd_shuffle";
    goto LAB_002aec34;
  case 0x15a:
    uVar5 = puVar6[3];
    id = puVar6[4];
    bVar10 = (this->msl_options).platform == iOS;
    pcVar8 = "quad_shuffle_xor";
    pcVar9 = "simd_shuffle_xor";
    goto LAB_002aec34;
  case 0x15b:
    uVar5 = puVar6[3];
    id = puVar6[4];
    bVar10 = (this->msl_options).platform == iOS;
    pcVar8 = "quad_shuffle_up";
    pcVar9 = "simd_shuffle_up";
    goto LAB_002aec34;
  case 0x15c:
    uVar5 = puVar6[3];
    id = puVar6[4];
    bVar10 = (this->msl_options).platform == iOS;
    pcVar8 = "quad_shuffle_down";
    pcVar9 = "simd_shuffle_down";
LAB_002aec34:
    if (bVar10) {
      pcVar9 = pcVar8;
    }
LAB_002af085:
    expr = local_5c;
    CompilerGLSL::emit_binary_func_op(&this->super_CompilerGLSL,uVar3,local_5c,uVar5,id,pcVar9);
    goto LAB_002af0de;
  case 0x15d:
    switch(puVar6[3]) {
    case 0:
switchD_002aeb91_caseD_0:
      uVar5 = puVar6[4];
      pcVar9 = "simd_sum";
      break;
    case 1:
switchD_002aeb91_caseD_1:
      uVar5 = puVar6[4];
      pcVar9 = "simd_prefix_inclusive_sum";
      break;
    case 2:
switchD_002aeb91_caseD_2:
      uVar5 = puVar6[4];
      pcVar9 = "simd_prefix_exclusive_sum";
      break;
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
LAB_002af0a1:
      uVar5 = puVar6[4];
      pcVar9 = "quad_sum";
      break;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x15e:
    switch(puVar6[3]) {
    case 0:
      goto switchD_002aeb91_caseD_0;
    case 1:
      goto switchD_002aeb91_caseD_1;
    case 2:
      goto switchD_002aeb91_caseD_2;
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_002af0a1;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  case 0x15f:
    switch(puVar6[3]) {
    case 0:
switchD_002aed7e_caseD_0:
      uVar5 = puVar6[4];
      pcVar9 = "simd_product";
      break;
    case 1:
switchD_002aed7e_caseD_1:
      uVar5 = puVar6[4];
      pcVar9 = "simd_prefix_inclusive_product";
      break;
    case 2:
switchD_002aed7e_caseD_2:
      uVar5 = puVar6[4];
      pcVar9 = "simd_prefix_exclusive_product";
      break;
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
LAB_002af0c3:
      uVar5 = puVar6[4];
      pcVar9 = "quad_product";
      break;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x160:
    switch(puVar6[3]) {
    case 0:
      goto switchD_002aed7e_caseD_0;
    case 1:
      goto switchD_002aed7e_caseD_1;
    case 2:
      goto switchD_002aed7e_caseD_2;
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_002af0c3;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  case 0x161:
    switch(puVar6[3]) {
    case 0:
      uVar5 = puVar6[4];
      pcVar9 = "simd_min";
      break;
    case 1:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformSMin.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 2:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformSMin.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar5 = puVar6[4];
      pcVar9 = "quad_min";
      break;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto LAB_002af003;
  case 0x162:
    switch(puVar6[3]) {
    case 0:
      uVar5 = puVar6[4];
      pcVar9 = "simd_min";
      input_type = BVar4;
      break;
    case 1:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformUMin.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 2:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformUMin.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar5 = puVar6[4];
      pcVar9 = "quad_min";
      input_type = BVar4;
      break;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto LAB_002af003;
  case 0x163:
    switch(puVar6[3]) {
    case 0:
      uVar5 = puVar6[4];
      pcVar9 = "simd_min";
      break;
    case 1:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformFMin.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 2:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformFMin.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar5 = puVar6[4];
      pcVar9 = "quad_min";
      break;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x164:
    switch(puVar6[3]) {
    case 0:
      uVar5 = puVar6[4];
      pcVar9 = "simd_max";
      break;
    case 1:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformSMax.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 2:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformSMax.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar5 = puVar6[4];
      pcVar9 = "quad_max";
      break;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto LAB_002af003;
  case 0x165:
    switch(puVar6[3]) {
    case 0:
      uVar5 = puVar6[4];
      pcVar9 = "simd_max";
      input_type = BVar4;
      break;
    case 1:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformUMax.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 2:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformUMax.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar5 = puVar6[4];
      pcVar9 = "quad_max";
      input_type = BVar4;
      break;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
LAB_002af003:
    expr = local_5c;
    CompilerGLSL::emit_unary_func_op_cast
              (&this->super_CompilerGLSL,uVar3,local_5c,uVar5,pcVar9,input_type,input_type);
    goto LAB_002af0de;
  case 0x166:
    switch(puVar6[3]) {
    case 0:
      uVar5 = puVar6[4];
      pcVar9 = "simd_max";
      break;
    case 1:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformFMax.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 2:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Metal doesn\'t support ExclusiveScan for OpGroupNonUniformFMax.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar5 = puVar6[4];
      pcVar9 = "quad_max";
      break;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x167:
    switch(puVar6[3]) {
    case 0:
switchD_002aee0c_caseD_0:
      uVar5 = puVar6[4];
      pcVar9 = "simd_and";
      break;
    case 1:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,
                 "Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseAnd.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 2:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,
                 "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseAnd.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
LAB_002af047:
      uVar5 = puVar6[4];
      pcVar9 = "quad_and";
      break;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x168:
    switch(puVar6[3]) {
    case 0:
switchD_002aed0e_caseD_0:
      uVar5 = puVar6[4];
      pcVar9 = "simd_or";
      break;
    case 1:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,
                 "Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseOr.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 2:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,
                 "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseOr.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
LAB_002aef9c:
      uVar5 = puVar6[4];
      pcVar9 = "quad_or";
      break;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x169:
    switch(puVar6[3]) {
    case 0:
switchD_002aeb10_caseD_0:
      uVar5 = puVar6[4];
      pcVar9 = "simd_xor";
      break;
    case 1:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,
                 "Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseXor.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 2:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,
                 "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseXor.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
LAB_002af022:
      uVar5 = puVar6[4];
      pcVar9 = "quad_xor";
      break;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    break;
  case 0x16a:
    switch(puVar6[3]) {
    case 0:
      goto switchD_002aee0c_caseD_0;
    case 1:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,
                 "Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalAnd.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 2:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,
                 "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalAnd.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_002af047;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  case 0x16b:
    switch(puVar6[3]) {
    case 0:
      goto switchD_002aed0e_caseD_0;
    case 1:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,
                 "Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalOr.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 2:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,
                 "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalOr.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_002aef9c;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  case 0x16c:
    switch(puVar6[3]) {
    case 0:
      goto switchD_002aeb10_caseD_0;
    case 1:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,
                 "Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalXor.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 2:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,
                 "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalXor.",
                 (allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case 3:
      uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[5]);
      if (uVar5 != 4) {
        pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&mask,"Metal only supports quad ClusteredReduce.",
                   (allocator *)&local_60);
        CompilerError::CompilerError(pCVar7,(string *)&mask);
        __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_002af022;
    default:
      pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&mask,"Invalid group operation.",(allocator *)&local_60);
      CompilerError::CompilerError(pCVar7,(string *)&mask);
      __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  case 0x16d:
    uVar5 = puVar6[3];
    id = puVar6[4];
    pcVar9 = "quad_broadcast";
    goto LAB_002af085;
  case 0x16e:
    uVar5 = Compiler::evaluate_constant_u32((Compiler *)this,puVar6[4]);
    mask = uVar5 + 1;
    id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    local_60 = Compiler::expression_type_id((Compiler *)this,puVar6[4]);
    local_31 = false;
    Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
              ((Compiler *)this,id,&local_60,&mask,&local_31);
    uVar5 = puVar6[3];
    pcVar9 = "quad_shuffle_xor";
    goto LAB_002af085;
  default:
    pCVar7 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&mask,"Invalid opcode for subgroup.",(allocator *)&local_60);
    CompilerError::CompilerError(pCVar7,(string *)&mask);
    __cxa_throw(pCVar7,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  expr = local_5c;
  CompilerGLSL::emit_unary_func_op(&this->super_CompilerGLSL,uVar3,local_5c,uVar5,pcVar9);
LAB_002af0de:
  CompilerGLSL::register_control_dependent_expression(&this->super_CompilerGLSL,expr);
  return;
}

Assistant:

void CompilerMSL::emit_subgroup_op(const Instruction &i)
{
	const uint32_t *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	// Metal 2.0 is required. iOS only supports quad ops. macOS only supports
	// broadcast and shuffle on 10.13 (2.0), with full support in 10.14 (2.1).
	// Note that iOS makes no distinction between a quad-group and a subgroup;
	// all subgroups are quad-groups there.
	if (!msl_options.supports_msl_version(2))
		SPIRV_CROSS_THROW("Subgroups are only supported in Metal 2.0 and up.");

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_instruction(i);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	if (msl_options.is_ios())
	{
		switch (op)
		{
		default:
			SPIRV_CROSS_THROW("iOS only supports quad-group operations.");
		case OpGroupNonUniformBroadcast:
		case OpGroupNonUniformShuffle:
		case OpGroupNonUniformShuffleXor:
		case OpGroupNonUniformShuffleUp:
		case OpGroupNonUniformShuffleDown:
		case OpGroupNonUniformQuadSwap:
		case OpGroupNonUniformQuadBroadcast:
			break;
		}
	}

	if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 1))
	{
		switch (op)
		{
		default:
			SPIRV_CROSS_THROW("Subgroup ops beyond broadcast and shuffle on macOS require Metal 2.1 and up.");
		case OpGroupNonUniformBroadcast:
		case OpGroupNonUniformShuffle:
		case OpGroupNonUniformShuffleXor:
		case OpGroupNonUniformShuffleUp:
		case OpGroupNonUniformShuffleDown:
			break;
		}
	}

	uint32_t result_type = ops[0];
	uint32_t id = ops[1];

	auto scope = static_cast<Scope>(evaluate_constant_u32(ops[2]));
	if (scope != ScopeSubgroup)
		SPIRV_CROSS_THROW("Only subgroup scope is supported.");

	switch (op)
	{
	case OpGroupNonUniformElect:
		emit_op(result_type, id, "simd_is_first()", true);
		break;

	case OpGroupNonUniformBroadcast:
		emit_binary_func_op(result_type, id, ops[3], ops[4],
		                    msl_options.is_ios() ? "quad_broadcast" : "simd_broadcast");
		break;

	case OpGroupNonUniformBroadcastFirst:
		emit_unary_func_op(result_type, id, ops[3], "simd_broadcast_first");
		break;

	case OpGroupNonUniformBallot:
		emit_unary_func_op(result_type, id, ops[3], "spvSubgroupBallot");
		break;

	case OpGroupNonUniformInverseBallot:
		emit_binary_func_op(result_type, id, ops[3], builtin_subgroup_invocation_id_id, "spvSubgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotBitExtract:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "spvSubgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotFindLSB:
		emit_unary_func_op(result_type, id, ops[3], "spvSubgroupBallotFindLSB");
		break;

	case OpGroupNonUniformBallotFindMSB:
		emit_unary_func_op(result_type, id, ops[3], "spvSubgroupBallotFindMSB");
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce)
			emit_unary_func_op(result_type, id, ops[4], "spvSubgroupBallotBitCount");
		else if (operation == GroupOperationInclusiveScan)
			emit_binary_func_op(result_type, id, ops[4], builtin_subgroup_invocation_id_id,
			                    "spvSubgroupBallotInclusiveBitCount");
		else if (operation == GroupOperationExclusiveScan)
			emit_binary_func_op(result_type, id, ops[4], builtin_subgroup_invocation_id_id,
			                    "spvSubgroupBallotExclusiveBitCount");
		else
			SPIRV_CROSS_THROW("Invalid BitCount operation.");
		break;
	}

	case OpGroupNonUniformShuffle:
		emit_binary_func_op(result_type, id, ops[3], ops[4], msl_options.is_ios() ? "quad_shuffle" : "simd_shuffle");
		break;

	case OpGroupNonUniformShuffleXor:
		emit_binary_func_op(result_type, id, ops[3], ops[4],
		                    msl_options.is_ios() ? "quad_shuffle_xor" : "simd_shuffle_xor");
		break;

	case OpGroupNonUniformShuffleUp:
		emit_binary_func_op(result_type, id, ops[3], ops[4],
		                    msl_options.is_ios() ? "quad_shuffle_up" : "simd_shuffle_up");
		break;

	case OpGroupNonUniformShuffleDown:
		emit_binary_func_op(result_type, id, ops[3], ops[4],
		                    msl_options.is_ios() ? "quad_shuffle_down" : "simd_shuffle_down");
		break;

	case OpGroupNonUniformAll:
		emit_unary_func_op(result_type, id, ops[3], "simd_all");
		break;

	case OpGroupNonUniformAny:
		emit_unary_func_op(result_type, id, ops[3], "simd_any");
		break;

	case OpGroupNonUniformAllEqual:
		emit_unary_func_op(result_type, id, ops[3], "spvSubgroupAllEqual");
		break;

		// clang-format off
#define MSL_GROUP_OP(op, msl_op) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op(result_type, id, ops[4], "simd_" #msl_op); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "simd_prefix_inclusive_" #msl_op); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "simd_prefix_exclusive_" #msl_op); \
		else if (operation == GroupOperationClusteredReduce) \
		{ \
			/* Only cluster sizes of 4 are supported. */ \
			uint32_t cluster_size = evaluate_constant_u32(ops[5]); \
			if (cluster_size != 4) \
				SPIRV_CROSS_THROW("Metal only supports quad ClusteredReduce."); \
			emit_unary_func_op(result_type, id, ops[4], "quad_" #msl_op); \
		} \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}